

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_utils.hpp
# Opt level: O3

string * vector_utils::to_string<volume_mapping>
                   (string *__return_storage_ptr__,
                   vector<volume_mapping,_std::allocator<volume_mapping>_> *array)

{
  pointer pvVar1;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  pointer this;
  string res;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  this = (array->super__Vector_base<volume_mapping,_std::allocator<volume_mapping>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pvVar1 = (array->super__Vector_base<volume_mapping,_std::allocator<volume_mapping>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (this != pvVar1) {
    do {
      volume_mapping::to_string_abi_cxx11_(&local_70,this);
      std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      this = this + 1;
    } while (this != pvVar1);
  }
  std::operator+(&local_70,"[ ",&local_50);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static string to_string(const vector<T>& array) {
    string res;
    for (auto& x : array) {
      res += x.to_string();
    }
    return "[ " + res + "]";
  }